

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pivot.cpp
# Opt level: O1

PivotColumn * __thiscall
duckdb::Transformer::TransformPivotColumn
          (PivotColumn *__return_storage_ptr__,Transformer *this,PGPivot *pivot,bool is_pivot)

{
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  char *__s;
  char *pcVar3;
  optional_idx oVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  PGPivot *pPVar7;
  bool bVar8;
  int iVar9;
  pointer pPVar10;
  ParserException *pPVar11;
  InternalException *this_00;
  undefined7 in_register_00000009;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_01
  ;
  pointer *__ptr;
  Transformer *this_02;
  optional_ptr<duckdb_libpgquery::PGNode,_true> node;
  PGListCell *pPVar12;
  __node_base this_03;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> expr;
  PivotColumnEntry entry;
  undefined1 local_108 [16];
  undefined1 local_f8 [32];
  _Alloc_hider local_d8;
  __node_base local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  char local_b4;
  Transformer *local_b0;
  PGPivot *local_a8;
  __node_base local_a0;
  undefined1 local_98 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  _local_b4 = (undefined4)CONCAT71(in_register_00000009,is_pivot);
  (__return_storage_ptr__->entries).
  super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->entries).
  super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->entries).
  super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->unpivot_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->unpivot_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->pivot_expressions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->unpivot_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->pivot_expressions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->pivot_expressions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->pivot_enum)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->pivot_enum).field_2;
  (__return_storage_ptr__->pivot_enum)._M_string_length = 0;
  (__return_storage_ptr__->pivot_enum).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->subquery).
  super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
  local_b0 = this;
  if (pivot->pivot_columns == (PGList *)0x0) {
    if (pivot->unpivot_columns == (PGList *)0x0) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_f8._0_8_ = local_f8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,"Either pivot_columns or unpivot_columns must be defined","");
      InternalException::InternalException(this_00,(string *)local_f8);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    TransformStringList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_98,this,pivot->unpivot_columns);
    local_f8._0_8_ =
         (__return_storage_ptr__->unpivot_names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_f8._8_8_ =
         (__return_storage_ptr__->unpivot_names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_f8._16_8_ =
         (__return_storage_ptr__->unpivot_names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->unpivot_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_98._0_8_;
    (__return_storage_ptr__->unpivot_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_98._8_8_;
    (__return_storage_ptr__->unpivot_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_98._16_8_;
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = (pointer)0x0;
    local_98._16_8_ = (pointer)0x0;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_98);
  }
  else {
    TransformExpressionList(this,pivot->pivot_columns,&__return_storage_ptr__->pivot_expressions);
    puVar1 = (__return_storage_ptr__->pivot_expressions).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_01 = (__return_storage_ptr__->pivot_expressions).
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar1;
        this_01 = this_01 + 1) {
      pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(this_01);
      iVar9 = (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[5])(pPVar10);
      if ((char)iVar9 != '\0') {
        pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
        pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(this_01);
        oVar4.index = (pPVar10->super_BaseExpression).query_location.index;
        local_f8._0_8_ = local_f8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f8,"Cannot pivot on constant value \"%s\"","");
        pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(this_01);
        (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pPVar10);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar11,oVar4,(string *)local_f8,&local_50);
        __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(this_01);
      iVar9 = (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[4])(pPVar10);
      if ((char)iVar9 != '\0') {
        pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
        pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(this_01);
        oVar4.index = (pPVar10->super_BaseExpression).query_location.index;
        local_f8._0_8_ = local_f8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f8,"Cannot pivot on subquery \"%s\"","");
        pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(this_01);
        (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[8])(&local_70,pPVar10);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar11,oVar4,(string *)local_f8,&local_70);
        __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  node.ptr = (PGNode *)local_b0;
  local_108._8_8_ = __return_storage_ptr__;
  local_a8 = pivot;
  if ((pivot->pivot_value != (PGList *)0x0) &&
     (pPVar12 = pivot->pivot_value->head, pPVar12 != (PGListCell *)0x0)) {
    this_03._M_nxt = (_Hash_node_base *)&__return_storage_ptr__->entries;
    local_a0._M_nxt = this_03._M_nxt;
    do {
      TransformExpression((Transformer *)local_108,node);
      local_f8._16_8_ = (pointer)0x0;
      local_f8._24_8_ = (ParsedExpression *)0x0;
      local_f8._0_8_ = (Transformer *)0x0;
      local_f8._8_8_ = (Transformer *)0x0;
      local_d0._M_nxt = (_Hash_node_base *)0x0;
      local_c8._M_local_buf[0] = '\0';
      local_d8._M_p = (pointer)&local_c8;
      unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
      operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_108);
      ::std::__cxx11::string::_M_assign((string *)&local_d8);
      bVar8 = TransformPivotInList
                        ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)local_108,(PivotColumnEntry *)local_f8,false);
      uVar6 = local_f8._8_8_;
      uVar5 = local_f8._0_8_;
      if (!bVar8) {
        if (local_b4 != '\0') {
          pPVar11 = (ParserException *)__cxa_allocate_exception(0x10);
          pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                  *)local_108);
          oVar4.index = (pPVar10->super_BaseExpression).query_location.index;
          local_98._0_8_ = local_98 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,"PIVOT IN list must contain columns or lists of columns","")
          ;
          ParserException::ParserException<>(pPVar11,oVar4,(string *)local_98);
          __cxa_throw(pPVar11,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        this_02 = (Transformer *)local_f8._0_8_;
        if (local_f8._8_8_ != local_f8._0_8_) {
          do {
            Value::~Value((Value *)this_02);
            this_02 = (Transformer *)
                      &(this_02->named_param_map)._M_h._M_rehash_policy._M_next_resize;
          } while (this_02 != (Transformer *)uVar6);
          local_f8._8_8_ = uVar5;
          node.ptr = (PGNode *)local_b0;
        }
        this_03._M_nxt = local_a0._M_nxt;
        uVar5 = local_f8._24_8_;
        local_f8._24_8_ = local_108._0_8_;
        local_108._0_8_ = (ParsedExpression *)0x0;
        if ((ParsedExpression *)uVar5 != (ParsedExpression *)0x0) {
          (*(code *)(*(_Hash_node_base **)uVar5)[1]._M_nxt)();
        }
      }
      ::std::vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>::
      emplace_back<duckdb::PivotColumnEntry>
                ((vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_> *)
                 this_03._M_nxt,(PivotColumnEntry *)local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_p != &local_c8) {
        operator_delete(local_d8._M_p);
      }
      if ((ParsedExpression *)local_f8._24_8_ != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)local_f8._24_8_ + 8))();
      }
      local_f8._24_8_ = (_Hash_node_base *)0x0;
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_f8);
      if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           )local_108._0_8_ != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)local_108._0_8_ + 8))();
      }
      pPVar12 = pPVar12->next;
    } while (pPVar12 != (PGListCell *)0x0);
  }
  pPVar7 = local_a8;
  uVar5 = local_108._8_8_;
  if (local_a8->subquery != (PGNode *)0x0) {
    TransformSelectNode((Transformer *)local_f8,node.ptr,SUB81(local_a8->subquery,0));
    uVar6 = local_f8._0_8_;
    local_f8._0_8_ = (Transformer *)0x0;
    _Var2._M_head_impl =
         (((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
          (uVar5 + 0x68))->
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)(uVar5 + 0x68))
    ->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)uVar6;
    if (_Var2._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
    }
    if ((Transformer *)local_f8._0_8_ != (Transformer *)0x0) {
      (**(code **)(*(long *)local_f8._0_8_ + 8))();
    }
  }
  __s = pPVar7->pivot_enum;
  if (__s != (char *)0x0) {
    pcVar3 = (char *)((string *)(uVar5 + 0x48))->_M_string_length;
    strlen(__s);
    ::std::__cxx11::string::_M_replace((ulong)(uVar5 + 0x48),0,pcVar3,(ulong)__s);
  }
  return (PivotColumn *)uVar5;
}

Assistant:

PivotColumn Transformer::TransformPivotColumn(duckdb_libpgquery::PGPivot &pivot, bool is_pivot) {
	PivotColumn col;
	if (pivot.pivot_columns) {
		TransformExpressionList(*pivot.pivot_columns, col.pivot_expressions);
		for (auto &expr : col.pivot_expressions) {
			if (expr->IsScalar()) {
				throw ParserException(expr->GetQueryLocation(), "Cannot pivot on constant value \"%s\"",
				                      expr->ToString());
			}
			if (expr->HasSubquery()) {
				throw ParserException(expr->GetQueryLocation(), "Cannot pivot on subquery \"%s\"", expr->ToString());
			}
		}
	} else if (pivot.unpivot_columns) {
		col.unpivot_names = TransformStringList(pivot.unpivot_columns);
	} else {
		throw InternalException("Either pivot_columns or unpivot_columns must be defined");
	}
	if (pivot.pivot_value) {
		for (auto node = pivot.pivot_value->head; node != nullptr; node = node->next) {
			auto n = PGPointerCast<duckdb_libpgquery::PGNode>(node->data.ptr_value);
			auto expr = TransformExpression(n);
			PivotColumnEntry entry;
			entry.alias = expr->GetAlias();
			auto transformed = TransformPivotInList(expr, entry);
			if (!transformed) {
				// could not transform into list of constant values
				if (is_pivot) {
					// for pivot - throw an exception
					throw ParserException(expr->GetQueryLocation(),
					                      "PIVOT IN list must contain columns or lists of columns");
				} else {
					// for unpivot - we can forward the expression immediately
					entry.values.clear();
					entry.expr = std::move(expr);
				}
			}
			col.entries.push_back(std::move(entry));
		}
	}
	if (pivot.subquery) {
		col.subquery = TransformSelectNode(*pivot.subquery);
	}
	if (pivot.pivot_enum) {
		col.pivot_enum = pivot.pivot_enum;
	}
	return col;
}